

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofiletools.cpp
# Opt level: O0

string * __thiscall
libcellml::generatorProfileAsString_abi_cxx11_
          (string *__return_storage_ptr__,libcellml *this,GeneratorProfilePtr *generatorProfile)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  string *local_2740;
  string *local_2730;
  string *local_2720;
  string *local_2710;
  string *local_2700;
  string *local_26f0;
  string *local_26e0;
  string *local_26d0;
  string *local_26c0;
  string *local_26b0;
  string *local_26a0;
  string *local_2688;
  string *local_2678;
  string local_2650;
  string local_2630;
  string local_2610;
  string local_25f0;
  string local_25d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25b0;
  string local_2590;
  string local_2570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2550;
  string local_2530;
  string local_2510;
  string local_24f0;
  string local_24d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24b0;
  string local_2490;
  string local_2470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2450;
  string local_2430;
  string local_2410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23f0;
  string local_23d0;
  string local_23b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2390;
  string local_2370;
  string local_2350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2330;
  string local_2310;
  string local_22f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22d0;
  string local_22b0;
  string local_2290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2270;
  string local_2250;
  string local_2230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2210;
  string local_21f0;
  string local_21d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21b0;
  string local_2190;
  string local_2170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2150;
  string local_2130;
  string local_2110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20f0;
  string local_20d0;
  string local_20b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2090;
  string local_2070;
  string local_2050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2030;
  string local_2010;
  string local_1ff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fd0;
  string local_1fb0;
  string local_1f90;
  string local_1f70;
  string local_1f50;
  string local_1f30;
  string local_1f10;
  string local_1ef0;
  string local_1ed0;
  string local_1eb0;
  string local_1e90;
  string local_1e70;
  string local_1e50;
  string local_1e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cb0;
  string local_1c90;
  string local_1c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c50;
  string local_1c30;
  string local_1c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bf0;
  string local_1bd0;
  string local_1bb0;
  string local_1b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b50;
  string local_1b30;
  string local_1b10;
  string local_1af0;
  string local_1ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ab0;
  string local_1a90;
  string local_1a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a50;
  string local_1a30;
  string local_1a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19f0;
  string local_19d0;
  string local_19b0;
  string local_1990;
  string local_1970;
  string local_1950;
  string local_1930;
  string local_1910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1870;
  string local_1850;
  string local_1830;
  string local_1810;
  string local_17f0;
  string local_17d0;
  string local_17b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1790;
  string local_1770;
  string local_1750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1730;
  string local_1710;
  string local_16f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16d0;
  string local_16b0;
  string local_1690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1670;
  string local_1650;
  string local_1630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1610;
  string local_15f0;
  string local_15d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b0;
  string local_1590;
  string local_1570;
  string local_1550;
  string local_1530;
  string local_1510;
  string local_14f0;
  string local_14d0;
  string local_14b0;
  string local_1490;
  string local_1470;
  string local_1450;
  string local_1430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d0;
  string local_12b0;
  string local_1290;
  string local_1270;
  string local_1250;
  string local_1230;
  string local_1210;
  string local_11f0;
  string local_11d0;
  string local_11b0;
  string local_1190;
  string local_1170;
  string local_1150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1090;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1070;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ff0;
  string local_fd0;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  undefined1 local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  libcellml *local_18;
  GeneratorProfilePtr *generatorProfile_local;
  string *profileContents;
  
  local_18 = this;
  generatorProfile_local = (GeneratorProfilePtr *)__return_storage_ptr__;
  if ((generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
       TRUE_VALUE_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                                   ::TRUE_VALUE_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                ::TRUE_VALUE_abi_cxx11_,"true",&local_19);
    std::allocator<char>::~allocator(&local_19);
    __cxa_atexit(std::__cxx11::string::~string,
                 &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                         ::TRUE_VALUE_abi_cxx11_);
  }
  if ((generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)::
       FALSE_VALUE_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                                   ::FALSE_VALUE_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                ::FALSE_VALUE_abi_cxx11_,"false",local_2d);
    std::allocator<char>::~allocator(local_2d);
    __cxa_atexit(std::__cxx11::string::~string,
                 &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                         ::FALSE_VALUE_abi_cxx11_);
  }
  local_2e = 0;
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasInterface(peVar3);
  if (bVar1) {
    local_2678 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_2678 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_2678);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::equalityString_abi_cxx11_(&local_50,peVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::eqString_abi_cxx11_(&local_190,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::neqString_abi_cxx11_(&local_1b0,peVar3);
  std::operator+(&local_170,&local_190,&local_1b0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::ltString_abi_cxx11_(&local_1d0,peVar3);
  std::operator+(&local_150,&local_170,&local_1d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::leqString_abi_cxx11_(&local_1f0,peVar3);
  std::operator+(&local_130,&local_150,&local_1f0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::gtString_abi_cxx11_(&local_210,peVar3);
  std::operator+(&local_110,&local_130,&local_210);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::geqString_abi_cxx11_(&local_230,peVar3);
  std::operator+(&local_f0,&local_110,&local_230);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::andString_abi_cxx11_(&local_250,peVar3);
  std::operator+(&local_d0,&local_f0,&local_250);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::orString_abi_cxx11_(&local_270,peVar3);
  std::operator+(&local_b0,&local_d0,&local_270);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::xorString_abi_cxx11_(&local_290,peVar3);
  std::operator+(&local_90,&local_b0,&local_290);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::notString_abi_cxx11_(&local_2b0,peVar3);
  std::operator+(&local_70,&local_90,&local_2b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_190);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasEqOperator(peVar3);
  if (bVar1) {
    local_2688 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_2688 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasNeqOperator(peVar3);
  if (bVar1) {
    local_26a0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_26a0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_3d0,local_2688,local_26a0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasLtOperator(peVar3);
  if (bVar1) {
    local_26b0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_26b0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_3b0,&local_3d0,local_26b0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasLeqOperator(peVar3);
  if (bVar1) {
    local_26c0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_26c0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_390,&local_3b0,local_26c0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasGtOperator(peVar3);
  if (bVar1) {
    local_26d0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_26d0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_370,&local_390,local_26d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasGeqOperator(peVar3);
  if (bVar1) {
    local_26e0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_26e0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_350,&local_370,local_26e0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasAndOperator(peVar3);
  if (bVar1) {
    local_26f0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_26f0 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_330,&local_350,local_26f0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasOrOperator(peVar3);
  if (bVar1) {
    local_2700 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_2700 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_310,&local_330,local_2700);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasXorOperator(peVar3);
  if (bVar1) {
    local_2710 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_2710 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_2f0,&local_310,local_2710);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasNotOperator(peVar3);
  if (bVar1) {
    local_2720 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_2720 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::operator+(&local_2d0,&local_2f0,local_2720);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::plusString_abi_cxx11_(&local_5d0,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::minusString_abi_cxx11_(&local_5f0,peVar3);
  std::operator+(&local_5b0,&local_5d0,&local_5f0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::timesString_abi_cxx11_(&local_610,peVar3);
  std::operator+(&local_590,&local_5b0,&local_610);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::divideString_abi_cxx11_(&local_630,peVar3);
  std::operator+(&local_570,&local_590,&local_630);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::powerString_abi_cxx11_(&local_650,peVar3);
  std::operator+(&local_550,&local_570,&local_650);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::squareRootString_abi_cxx11_(&local_670,peVar3);
  std::operator+(&local_530,&local_550,&local_670);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::squareString_abi_cxx11_(&local_690,peVar3);
  std::operator+(&local_510,&local_530,&local_690);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::absoluteValueString_abi_cxx11_(&local_6b0,peVar3);
  std::operator+(&local_4f0,&local_510,&local_6b0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::exponentialString_abi_cxx11_(&local_6d0,peVar3);
  std::operator+(&local_4d0,&local_4f0,&local_6d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::naturalLogarithmString_abi_cxx11_(&local_6f0,peVar3);
  std::operator+(&local_4b0,&local_4d0,&local_6f0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::commonLogarithmString_abi_cxx11_(&local_710,peVar3);
  std::operator+(&local_490,&local_4b0,&local_710);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::ceilingString_abi_cxx11_(&local_730,peVar3);
  std::operator+(&local_470,&local_490,&local_730);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::floorString_abi_cxx11_(&local_750,peVar3);
  std::operator+(&local_450,&local_470,&local_750);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::minString_abi_cxx11_(&local_770,peVar3);
  std::operator+(&local_430,&local_450,&local_770);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::maxString_abi_cxx11_(&local_790,peVar3);
  std::operator+(&local_410,&local_430,&local_790);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::remString_abi_cxx11_(&local_7b0,peVar3);
  std::operator+(&local_3f0,&local_410,&local_7b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_5d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasPowerOperator(peVar3);
  if (bVar1) {
    local_2730 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_2730 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_2730);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::sinString_abi_cxx11_(&local_ab0,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::cosString_abi_cxx11_(&local_ad0,peVar3);
  std::operator+(&local_a90,&local_ab0,&local_ad0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::tanString_abi_cxx11_(&local_af0,peVar3);
  std::operator+(&local_a70,&local_a90,&local_af0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::secString_abi_cxx11_(&local_b10,peVar3);
  std::operator+(&local_a50,&local_a70,&local_b10);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::cscString_abi_cxx11_(&local_b30,peVar3);
  std::operator+(&local_a30,&local_a50,&local_b30);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::cotString_abi_cxx11_(&local_b50,peVar3);
  std::operator+(&local_a10,&local_a30,&local_b50);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::sinhString_abi_cxx11_(&local_b70,peVar3);
  std::operator+(&local_9f0,&local_a10,&local_b70);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::coshString_abi_cxx11_(&local_b90,peVar3);
  std::operator+(&local_9d0,&local_9f0,&local_b90);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::tanhString_abi_cxx11_(&local_bb0,peVar3);
  std::operator+(&local_9b0,&local_9d0,&local_bb0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::sechString_abi_cxx11_(&local_bd0,peVar3);
  std::operator+(&local_990,&local_9b0,&local_bd0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::cschString_abi_cxx11_(&local_bf0,peVar3);
  std::operator+(&local_970,&local_990,&local_bf0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::cothString_abi_cxx11_(&local_c10,peVar3);
  std::operator+(&local_950,&local_970,&local_c10);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::asinString_abi_cxx11_(&local_c30,peVar3);
  std::operator+(&local_930,&local_950,&local_c30);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acosString_abi_cxx11_(&local_c50,peVar3);
  std::operator+(&local_910,&local_930,&local_c50);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::atanString_abi_cxx11_(&local_c70,peVar3);
  std::operator+(&local_8f0,&local_910,&local_c70);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::asecString_abi_cxx11_(&local_c90,peVar3);
  std::operator+(&local_8d0,&local_8f0,&local_c90);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acscString_abi_cxx11_(&local_cb0,peVar3);
  std::operator+(&local_8b0,&local_8d0,&local_cb0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acotString_abi_cxx11_(&local_cd0,peVar3);
  std::operator+(&local_890,&local_8b0,&local_cd0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::asinhString_abi_cxx11_(&local_cf0,peVar3);
  std::operator+(&local_870,&local_890,&local_cf0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acoshString_abi_cxx11_(&local_d10,peVar3);
  std::operator+(&local_850,&local_870,&local_d10);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::atanhString_abi_cxx11_(&local_d30,peVar3);
  std::operator+(&local_830,&local_850,&local_d30);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::asechString_abi_cxx11_(&local_d50,peVar3);
  std::operator+(&local_810,&local_830,&local_d50);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acschString_abi_cxx11_(&local_d70,peVar3);
  std::operator+(&local_7f0,&local_810,&local_d70);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acothString_abi_cxx11_(&local_d90,peVar3);
  std::operator+(&local_7d0,&local_7f0,&local_d90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_d90);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_d70);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_d50);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_d10);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_cf0);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_c90);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_c70);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_c50);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_c10);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_b90);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_b70);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_b50);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)&local_b30);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)&local_b10);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::__cxx11::string::~string((string *)&local_ab0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::conditionalOperatorIfString_abi_cxx11_(&local_e10,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::conditionalOperatorElseString_abi_cxx11_(&local_e30,peVar3);
  std::operator+(&local_df0,&local_e10,&local_e30);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::piecewiseIfString_abi_cxx11_(&local_e50,peVar3);
  std::operator+(&local_dd0,&local_df0,&local_e50);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::piecewiseElseString_abi_cxx11_(&local_e70,peVar3);
  std::operator+(&local_db0,&local_dd0,&local_e70);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_db0);
  std::__cxx11::string::~string((string *)&local_db0);
  std::__cxx11::string::~string((string *)&local_e70);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::__cxx11::string::~string((string *)&local_e50);
  std::__cxx11::string::~string((string *)&local_df0);
  std::__cxx11::string::~string((string *)&local_e30);
  std::__cxx11::string::~string((string *)&local_e10);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  bVar1 = GeneratorProfile::hasConditionalOperator(peVar3);
  if (bVar1) {
    local_2740 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::TRUE_VALUE_abi_cxx11_;
  }
  else {
    local_2740 = &generatorProfileAsString[abi:cxx11](std::shared_ptr<libcellml::GeneratorProfile>const&)
                  ::FALSE_VALUE_abi_cxx11_;
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_2740);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::trueString_abi_cxx11_(&local_f30,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::falseString_abi_cxx11_(&local_f50,peVar3);
  std::operator+(&local_f10,&local_f30,&local_f50);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::eString_abi_cxx11_(&local_f70,peVar3);
  std::operator+(&local_ef0,&local_f10,&local_f70);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::piString_abi_cxx11_(&local_f90,peVar3);
  std::operator+(&local_ed0,&local_ef0,&local_f90);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::infString_abi_cxx11_(&local_fb0,peVar3);
  std::operator+(&local_eb0,&local_ed0,&local_fb0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::nanString_abi_cxx11_(&local_fd0,peVar3);
  std::operator+(&local_e90,&local_eb0,&local_fd0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e90);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string((string *)&local_fd0);
  std::__cxx11::string::~string((string *)&local_eb0);
  std::__cxx11::string::~string((string *)&local_fb0);
  std::__cxx11::string::~string((string *)&local_ed0);
  std::__cxx11::string::~string((string *)&local_f90);
  std::__cxx11::string::~string((string *)&local_ef0);
  std::__cxx11::string::~string((string *)&local_f70);
  std::__cxx11::string::~string((string *)&local_f10);
  std::__cxx11::string::~string((string *)&local_f50);
  std::__cxx11::string::~string((string *)&local_f30);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::eqFunctionString_abi_cxx11_(&local_1150,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::neqFunctionString_abi_cxx11_(&local_1170,peVar3);
  std::operator+(&local_1130,&local_1150,&local_1170);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::ltFunctionString_abi_cxx11_(&local_1190,peVar3);
  std::operator+(&local_1110,&local_1130,&local_1190);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::leqFunctionString_abi_cxx11_(&local_11b0,peVar3);
  std::operator+(&local_10f0,&local_1110,&local_11b0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::gtFunctionString_abi_cxx11_(&local_11d0,peVar3);
  std::operator+(&local_10d0,&local_10f0,&local_11d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::geqFunctionString_abi_cxx11_(&local_11f0,peVar3);
  std::operator+(&local_10b0,&local_10d0,&local_11f0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::andFunctionString_abi_cxx11_(&local_1210,peVar3);
  std::operator+(&local_1090,&local_10b0,&local_1210);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::orFunctionString_abi_cxx11_(&local_1230,peVar3);
  std::operator+(&local_1070,&local_1090,&local_1230);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::xorFunctionString_abi_cxx11_(&local_1250,peVar3);
  std::operator+(&local_1050,&local_1070,&local_1250);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::notFunctionString_abi_cxx11_(&local_1270,peVar3);
  std::operator+(&local_1030,&local_1050,&local_1270);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::minFunctionString_abi_cxx11_(&local_1290,peVar3);
  std::operator+(&local_1010,&local_1030,&local_1290);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::maxFunctionString_abi_cxx11_(&local_12b0,peVar3);
  std::operator+(&local_ff0,&local_1010,&local_12b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_ff0);
  std::__cxx11::string::~string((string *)&local_ff0);
  std::__cxx11::string::~string((string *)&local_12b0);
  std::__cxx11::string::~string((string *)&local_1010);
  std::__cxx11::string::~string((string *)&local_1290);
  std::__cxx11::string::~string((string *)&local_1030);
  std::__cxx11::string::~string((string *)&local_1270);
  std::__cxx11::string::~string((string *)&local_1050);
  std::__cxx11::string::~string((string *)&local_1250);
  std::__cxx11::string::~string((string *)&local_1070);
  std::__cxx11::string::~string((string *)&local_1230);
  std::__cxx11::string::~string((string *)&local_1090);
  std::__cxx11::string::~string((string *)&local_1210);
  std::__cxx11::string::~string((string *)&local_10b0);
  std::__cxx11::string::~string((string *)&local_11f0);
  std::__cxx11::string::~string((string *)&local_10d0);
  std::__cxx11::string::~string((string *)&local_11d0);
  std::__cxx11::string::~string((string *)&local_10f0);
  std::__cxx11::string::~string((string *)&local_11b0);
  std::__cxx11::string::~string((string *)&local_1110);
  std::__cxx11::string::~string((string *)&local_1190);
  std::__cxx11::string::~string((string *)&local_1130);
  std::__cxx11::string::~string((string *)&local_1170);
  std::__cxx11::string::~string((string *)&local_1150);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::secFunctionString_abi_cxx11_(&local_1430,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::cscFunctionString_abi_cxx11_(&local_1450,peVar3);
  std::operator+(&local_1410,&local_1430,&local_1450);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::cotFunctionString_abi_cxx11_(&local_1470,peVar3);
  std::operator+(&local_13f0,&local_1410,&local_1470);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::sechFunctionString_abi_cxx11_(&local_1490,peVar3);
  std::operator+(&local_13d0,&local_13f0,&local_1490);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::cschFunctionString_abi_cxx11_(&local_14b0,peVar3);
  std::operator+(&local_13b0,&local_13d0,&local_14b0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::cothFunctionString_abi_cxx11_(&local_14d0,peVar3);
  std::operator+(&local_1390,&local_13b0,&local_14d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::asecFunctionString_abi_cxx11_(&local_14f0,peVar3);
  std::operator+(&local_1370,&local_1390,&local_14f0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acscFunctionString_abi_cxx11_(&local_1510,peVar3);
  std::operator+(&local_1350,&local_1370,&local_1510);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acotFunctionString_abi_cxx11_(&local_1530,peVar3);
  std::operator+(&local_1330,&local_1350,&local_1530);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::asechFunctionString_abi_cxx11_(&local_1550,peVar3);
  std::operator+(&local_1310,&local_1330,&local_1550);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acschFunctionString_abi_cxx11_(&local_1570,peVar3);
  std::operator+(&local_12f0,&local_1310,&local_1570);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::acothFunctionString_abi_cxx11_(&local_1590,peVar3);
  std::operator+(&local_12d0,&local_12f0,&local_1590);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_12d0);
  std::__cxx11::string::~string((string *)&local_12d0);
  std::__cxx11::string::~string((string *)&local_1590);
  std::__cxx11::string::~string((string *)&local_12f0);
  std::__cxx11::string::~string((string *)&local_1570);
  std::__cxx11::string::~string((string *)&local_1310);
  std::__cxx11::string::~string((string *)&local_1550);
  std::__cxx11::string::~string((string *)&local_1330);
  std::__cxx11::string::~string((string *)&local_1530);
  std::__cxx11::string::~string((string *)&local_1350);
  std::__cxx11::string::~string((string *)&local_1510);
  std::__cxx11::string::~string((string *)&local_1370);
  std::__cxx11::string::~string((string *)&local_14f0);
  std::__cxx11::string::~string((string *)&local_1390);
  std::__cxx11::string::~string((string *)&local_14d0);
  std::__cxx11::string::~string((string *)&local_13b0);
  std::__cxx11::string::~string((string *)&local_14b0);
  std::__cxx11::string::~string((string *)&local_13d0);
  std::__cxx11::string::~string((string *)&local_1490);
  std::__cxx11::string::~string((string *)&local_13f0);
  std::__cxx11::string::~string((string *)&local_1470);
  std::__cxx11::string::~string((string *)&local_1410);
  std::__cxx11::string::~string((string *)&local_1450);
  std::__cxx11::string::~string((string *)&local_1430);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::commentString_abi_cxx11_(&local_15d0,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::originCommentString_abi_cxx11_(&local_15f0,peVar3);
  std::operator+(&local_15b0,&local_15d0,&local_15f0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_15b0);
  std::__cxx11::string::~string((string *)&local_15b0);
  std::__cxx11::string::~string((string *)&local_15f0);
  std::__cxx11::string::~string((string *)&local_15d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceHeaderString_abi_cxx11_(&local_1630,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationHeaderString_abi_cxx11_(&local_1650,peVar3);
  std::operator+(&local_1610,&local_1630,&local_1650);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1610);
  std::__cxx11::string::~string((string *)&local_1610);
  std::__cxx11::string::~string((string *)&local_1650);
  std::__cxx11::string::~string((string *)&local_1630);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceVersionString_abi_cxx11_(&local_1690,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationVersionString_abi_cxx11_(&local_16b0,peVar3);
  std::operator+(&local_1670,&local_1690,&local_16b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1670);
  std::__cxx11::string::~string((string *)&local_1670);
  std::__cxx11::string::~string((string *)&local_16b0);
  std::__cxx11::string::~string((string *)&local_1690);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceLibcellmlVersionString_abi_cxx11_(&local_16f0,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationLibcellmlVersionString_abi_cxx11_(&local_1710,peVar3);
  std::operator+(&local_16d0,&local_16f0,&local_1710);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_16d0);
  std::__cxx11::string::~string((string *)&local_16d0);
  std::__cxx11::string::~string((string *)&local_1710);
  std::__cxx11::string::~string((string *)&local_16f0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceStateCountString_abi_cxx11_(&local_1750,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationStateCountString_abi_cxx11_(&local_1770,peVar3);
  std::operator+(&local_1730,&local_1750,&local_1770);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1730);
  std::__cxx11::string::~string((string *)&local_1730);
  std::__cxx11::string::~string((string *)&local_1770);
  std::__cxx11::string::~string((string *)&local_1750);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceVariableCountString_abi_cxx11_(&local_17b0,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationVariableCountString_abi_cxx11_(&local_17d0,peVar3);
  std::operator+(&local_1790,&local_17b0,&local_17d0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1790);
  std::__cxx11::string::~string((string *)&local_1790);
  std::__cxx11::string::~string((string *)&local_17d0);
  std::__cxx11::string::~string((string *)&local_17b0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::variableTypeObjectString_abi_cxx11_(&local_17f0,peVar3,false,false);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_17f0);
  std::__cxx11::string::~string((string *)&local_17f0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::variableTypeObjectString_abi_cxx11_(&local_1810,peVar3,false,true);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1810);
  std::__cxx11::string::~string((string *)&local_1810);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::variableTypeObjectString_abi_cxx11_(&local_1830,peVar3,true,false);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1830);
  std::__cxx11::string::~string((string *)&local_1830);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::variableTypeObjectString_abi_cxx11_(&local_1850,peVar3,true,true);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1850);
  std::__cxx11::string::~string((string *)&local_1850);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::variableOfIntegrationVariableTypeString_abi_cxx11_(&local_1910,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::stateVariableTypeString_abi_cxx11_(&local_1930,peVar3);
  std::operator+(&local_18f0,&local_1910,&local_1930);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::constantVariableTypeString_abi_cxx11_(&local_1950,peVar3);
  std::operator+(&local_18d0,&local_18f0,&local_1950);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::computedConstantVariableTypeString_abi_cxx11_(&local_1970,peVar3);
  std::operator+(&local_18b0,&local_18d0,&local_1970);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::algebraicVariableTypeString_abi_cxx11_(&local_1990,peVar3);
  std::operator+(&local_1890,&local_18b0,&local_1990);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::externalVariableTypeString_abi_cxx11_(&local_19b0,peVar3);
  std::operator+(&local_1870,&local_1890,&local_19b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1870);
  std::__cxx11::string::~string((string *)&local_1870);
  std::__cxx11::string::~string((string *)&local_19b0);
  std::__cxx11::string::~string((string *)&local_1890);
  std::__cxx11::string::~string((string *)&local_1990);
  std::__cxx11::string::~string((string *)&local_18b0);
  std::__cxx11::string::~string((string *)&local_1970);
  std::__cxx11::string::~string((string *)&local_18d0);
  std::__cxx11::string::~string((string *)&local_1950);
  std::__cxx11::string::~string((string *)&local_18f0);
  std::__cxx11::string::~string((string *)&local_1930);
  std::__cxx11::string::~string((string *)&local_1910);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::variableInfoObjectString_abi_cxx11_(&local_19d0,peVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_19d0);
  std::__cxx11::string::~string((string *)&local_19d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceVoiInfoString_abi_cxx11_(&local_1a10,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationVoiInfoString_abi_cxx11_(&local_1a30,peVar3);
  std::operator+(&local_19f0,&local_1a10,&local_1a30);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_19f0);
  std::__cxx11::string::~string((string *)&local_19f0);
  std::__cxx11::string::~string((string *)&local_1a30);
  std::__cxx11::string::~string((string *)&local_1a10);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceStateInfoString_abi_cxx11_(&local_1a70,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationStateInfoString_abi_cxx11_(&local_1a90,peVar3);
  std::operator+(&local_1a50,&local_1a70,&local_1a90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1a50);
  std::__cxx11::string::~string((string *)&local_1a50);
  std::__cxx11::string::~string((string *)&local_1a90);
  std::__cxx11::string::~string((string *)&local_1a70);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceVariableInfoString_abi_cxx11_(&local_1ad0,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationVariableInfoString_abi_cxx11_(&local_1af0,peVar3);
  std::operator+(&local_1ab0,&local_1ad0,&local_1af0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1ab0);
  std::__cxx11::string::~string((string *)&local_1ab0);
  std::__cxx11::string::~string((string *)&local_1af0);
  std::__cxx11::string::~string((string *)&local_1ad0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::variableInfoEntryString_abi_cxx11_(&local_1b10,peVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b10);
  std::__cxx11::string::~string((string *)&local_1b10);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::voiString_abi_cxx11_(&local_1b30,peVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b30);
  std::__cxx11::string::~string((string *)&local_1b30);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::statesArrayString_abi_cxx11_(&local_1b90,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::ratesArrayString_abi_cxx11_(&local_1bb0,peVar3);
  std::operator+(&local_1b70,&local_1b90,&local_1bb0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::variablesArrayString_abi_cxx11_(&local_1bd0,peVar3);
  std::operator+(&local_1b50,&local_1b70,&local_1bd0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b50);
  std::__cxx11::string::~string((string *)&local_1b50);
  std::__cxx11::string::~string((string *)&local_1bd0);
  std::__cxx11::string::~string((string *)&local_1b70);
  std::__cxx11::string::~string((string *)&local_1bb0);
  std::__cxx11::string::~string((string *)&local_1b90);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::externalVariableMethodTypeDefinitionString_abi_cxx11_(&local_1c10,peVar3,false);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::externalVariableMethodTypeDefinitionString_abi_cxx11_(&local_1c30,peVar3,true);
  std::operator+(&local_1bf0,&local_1c10,&local_1c30);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1bf0);
  std::__cxx11::string::~string((string *)&local_1bf0);
  std::__cxx11::string::~string((string *)&local_1c30);
  std::__cxx11::string::~string((string *)&local_1c10);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::externalVariableMethodCallString_abi_cxx11_(&local_1c70,peVar3,false);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::externalVariableMethodCallString_abi_cxx11_(&local_1c90,peVar3,true);
  std::operator+(&local_1c50,&local_1c70,&local_1c90);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1c50);
  std::__cxx11::string::~string((string *)&local_1c50);
  std::__cxx11::string::~string((string *)&local_1c90);
  std::__cxx11::string::~string((string *)&local_1c70);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::rootFindingInfoObjectString_abi_cxx11_(&local_1e30,peVar3,false);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::rootFindingInfoObjectString_abi_cxx11_(&local_1e50,peVar3,true);
  std::operator+(&local_1e10,&local_1e30,&local_1e50);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::externNlaSolveMethodString_abi_cxx11_(&local_1e70,peVar3);
  std::operator+(&local_1df0,&local_1e10,&local_1e70);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::findRootCallString_abi_cxx11_(&local_1e90,peVar3,false);
  std::operator+(&local_1dd0,&local_1df0,&local_1e90);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::findRootCallString_abi_cxx11_(&local_1eb0,peVar3,true);
  std::operator+(&local_1db0,&local_1dd0,&local_1eb0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::findRootMethodString_abi_cxx11_(&local_1ed0,peVar3,false);
  std::operator+(&local_1d90,&local_1db0,&local_1ed0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::findRootMethodString_abi_cxx11_(&local_1ef0,peVar3,true);
  std::operator+(&local_1d70,&local_1d90,&local_1ef0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::nlaSolveCallString_abi_cxx11_(&local_1f10,peVar3,false);
  std::operator+(&local_1d50,&local_1d70,&local_1f10);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::nlaSolveCallString_abi_cxx11_(&local_1f30,peVar3,true);
  std::operator+(&local_1d30,&local_1d50,&local_1f30);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::objectiveFunctionMethodString_abi_cxx11_(&local_1f50,peVar3,false);
  std::operator+(&local_1d10,&local_1d30,&local_1f50);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::objectiveFunctionMethodString_abi_cxx11_(&local_1f70,peVar3,true);
  std::operator+(&local_1cf0,&local_1d10,&local_1f70);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::uArrayString_abi_cxx11_(&local_1f90,peVar3);
  std::operator+(&local_1cd0,&local_1cf0,&local_1f90);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::fArrayString_abi_cxx11_(&local_1fb0,peVar3);
  std::operator+(&local_1cb0,&local_1cd0,&local_1fb0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1cb0);
  std::__cxx11::string::~string((string *)&local_1cb0);
  std::__cxx11::string::~string((string *)&local_1fb0);
  std::__cxx11::string::~string((string *)&local_1cd0);
  std::__cxx11::string::~string((string *)&local_1f90);
  std::__cxx11::string::~string((string *)&local_1cf0);
  std::__cxx11::string::~string((string *)&local_1f70);
  std::__cxx11::string::~string((string *)&local_1d10);
  std::__cxx11::string::~string((string *)&local_1f50);
  std::__cxx11::string::~string((string *)&local_1d30);
  std::__cxx11::string::~string((string *)&local_1f30);
  std::__cxx11::string::~string((string *)&local_1d50);
  std::__cxx11::string::~string((string *)&local_1f10);
  std::__cxx11::string::~string((string *)&local_1d70);
  std::__cxx11::string::~string((string *)&local_1ef0);
  std::__cxx11::string::~string((string *)&local_1d90);
  std::__cxx11::string::~string((string *)&local_1ed0);
  std::__cxx11::string::~string((string *)&local_1db0);
  std::__cxx11::string::~string((string *)&local_1eb0);
  std::__cxx11::string::~string((string *)&local_1dd0);
  std::__cxx11::string::~string((string *)&local_1e90);
  std::__cxx11::string::~string((string *)&local_1df0);
  std::__cxx11::string::~string((string *)&local_1e70);
  std::__cxx11::string::~string((string *)&local_1e10);
  std::__cxx11::string::~string((string *)&local_1e50);
  std::__cxx11::string::~string((string *)&local_1e30);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceCreateStatesArrayMethodString_abi_cxx11_(&local_1ff0,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationCreateStatesArrayMethodString_abi_cxx11_(&local_2010,peVar3);
  std::operator+(&local_1fd0,&local_1ff0,&local_2010);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1fd0);
  std::__cxx11::string::~string((string *)&local_1fd0);
  std::__cxx11::string::~string((string *)&local_2010);
  std::__cxx11::string::~string((string *)&local_1ff0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceCreateVariablesArrayMethodString_abi_cxx11_(&local_2050,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationCreateVariablesArrayMethodString_abi_cxx11_(&local_2070,peVar3);
  std::operator+(&local_2030,&local_2050,&local_2070);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2030);
  std::__cxx11::string::~string((string *)&local_2030);
  std::__cxx11::string::~string((string *)&local_2070);
  std::__cxx11::string::~string((string *)&local_2050);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceDeleteArrayMethodString_abi_cxx11_(&local_20b0,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationDeleteArrayMethodString_abi_cxx11_(&local_20d0,peVar3);
  std::operator+(&local_2090,&local_20b0,&local_20d0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2090);
  std::__cxx11::string::~string((string *)&local_2090);
  std::__cxx11::string::~string((string *)&local_20d0);
  std::__cxx11::string::~string((string *)&local_20b0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_2110,peVar3,false,false);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_2130,peVar3,false,false);
  std::operator+(&local_20f0,&local_2110,&local_2130);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_20f0);
  std::__cxx11::string::~string((string *)&local_20f0);
  std::__cxx11::string::~string((string *)&local_2130);
  std::__cxx11::string::~string((string *)&local_2110);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_2170,peVar3,false,true);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_2190,peVar3,false,true);
  std::operator+(&local_2150,&local_2170,&local_2190);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2150);
  std::__cxx11::string::~string((string *)&local_2150);
  std::__cxx11::string::~string((string *)&local_2190);
  std::__cxx11::string::~string((string *)&local_2170);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_21d0,peVar3,true,false);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_21f0,peVar3,true,false);
  std::operator+(&local_21b0,&local_21d0,&local_21f0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_21b0);
  std::__cxx11::string::~string((string *)&local_21b0);
  std::__cxx11::string::~string((string *)&local_21f0);
  std::__cxx11::string::~string((string *)&local_21d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceInitialiseVariablesMethodString_abi_cxx11_
            (&local_2230,peVar3,true,true);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
            (&local_2250,peVar3,true,true);
  std::operator+(&local_2210,&local_2230,&local_2250);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2210);
  std::__cxx11::string::~string((string *)&local_2210);
  std::__cxx11::string::~string((string *)&local_2250);
  std::__cxx11::string::~string((string *)&local_2230);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceComputeComputedConstantsMethodString_abi_cxx11_(&local_2290,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationComputeComputedConstantsMethodString_abi_cxx11_
            (&local_22b0,peVar3);
  std::operator+(&local_2270,&local_2290,&local_22b0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2270);
  std::__cxx11::string::~string((string *)&local_2270);
  std::__cxx11::string::~string((string *)&local_22b0);
  std::__cxx11::string::~string((string *)&local_2290);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceComputeRatesMethodString_abi_cxx11_(&local_22f0,peVar3,false);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationComputeRatesMethodString_abi_cxx11_(&local_2310,peVar3,false);
  std::operator+(&local_22d0,&local_22f0,&local_2310);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_22d0);
  std::__cxx11::string::~string((string *)&local_22d0);
  std::__cxx11::string::~string((string *)&local_2310);
  std::__cxx11::string::~string((string *)&local_22f0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceComputeRatesMethodString_abi_cxx11_(&local_2350,peVar3,true);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationComputeRatesMethodString_abi_cxx11_(&local_2370,peVar3,true);
  std::operator+(&local_2330,&local_2350,&local_2370);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2330);
  std::__cxx11::string::~string((string *)&local_2330);
  std::__cxx11::string::~string((string *)&local_2370);
  std::__cxx11::string::~string((string *)&local_2350);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_(&local_23b0,peVar3,false,false)
  ;
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_23d0,peVar3,false,false);
  std::operator+(&local_2390,&local_23b0,&local_23d0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2390);
  std::__cxx11::string::~string((string *)&local_2390);
  std::__cxx11::string::~string((string *)&local_23d0);
  std::__cxx11::string::~string((string *)&local_23b0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_(&local_2410,peVar3,false,true);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_2430,peVar3,false,true);
  std::operator+(&local_23f0,&local_2410,&local_2430);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_23f0);
  std::__cxx11::string::~string((string *)&local_23f0);
  std::__cxx11::string::~string((string *)&local_2430);
  std::__cxx11::string::~string((string *)&local_2410);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_(&local_2470,peVar3,true,false);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_2490,peVar3,true,false);
  std::operator+(&local_2450,&local_2470,&local_2490);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2450);
  std::__cxx11::string::~string((string *)&local_2450);
  std::__cxx11::string::~string((string *)&local_2490);
  std::__cxx11::string::~string((string *)&local_2470);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::interfaceComputeVariablesMethodString_abi_cxx11_(&local_24d0,peVar3,true,true);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
            (&local_24f0,peVar3,true,true);
  std::operator+(&local_24b0,&local_24d0,&local_24f0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_24b0);
  std::__cxx11::string::~string((string *)&local_24b0);
  std::__cxx11::string::~string((string *)&local_24f0);
  std::__cxx11::string::~string((string *)&local_24d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::emptyMethodString_abi_cxx11_(&local_2510,peVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2510);
  std::__cxx11::string::~string((string *)&local_2510);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::indentString_abi_cxx11_(&local_2530,peVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2530);
  std::__cxx11::string::~string((string *)&local_2530);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::openArrayInitialiserString_abi_cxx11_(&local_2570,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::closeArrayInitialiserString_abi_cxx11_(&local_2590,peVar3);
  std::operator+(&local_2550,&local_2570,&local_2590);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2550);
  std::__cxx11::string::~string((string *)&local_2550);
  std::__cxx11::string::~string((string *)&local_2590);
  std::__cxx11::string::~string((string *)&local_2570);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::openArrayString_abi_cxx11_(&local_25d0,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::closeArrayString_abi_cxx11_(&local_25f0,peVar3);
  std::operator+(&local_25b0,&local_25d0,&local_25f0);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_25b0);
  std::__cxx11::string::~string((string *)&local_25b0);
  std::__cxx11::string::~string((string *)&local_25f0);
  std::__cxx11::string::~string((string *)&local_25d0);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::arrayElementSeparatorString_abi_cxx11_(&local_2610,peVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2610);
  std::__cxx11::string::~string((string *)&local_2610);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::stringDelimiterString_abi_cxx11_(&local_2630,peVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2630);
  std::__cxx11::string::~string((string *)&local_2630);
  peVar3 = std::
           __shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_18);
  GeneratorProfile::commandSeparatorString_abi_cxx11_(&local_2650,peVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_2650);
  std::__cxx11::string::~string((string *)&local_2650);
  return __return_storage_ptr__;
}

Assistant:

std::string generatorProfileAsString(const GeneratorProfilePtr &generatorProfile)
{
    // Whether the profile requires an interface to be generated.

    static const std::string TRUE_VALUE = "true";
    static const std::string FALSE_VALUE = "false";

    auto profileContents = generatorProfile->hasInterface() ?
                               TRUE_VALUE :
                               FALSE_VALUE;

    // Equality.

    profileContents += generatorProfile->equalityString();

    // Relational and logical operators.

    profileContents += generatorProfile->eqString()
                       + generatorProfile->neqString()
                       + generatorProfile->ltString()
                       + generatorProfile->leqString()
                       + generatorProfile->gtString()
                       + generatorProfile->geqString()
                       + generatorProfile->andString()
                       + generatorProfile->orString()
                       + generatorProfile->xorString()
                       + generatorProfile->notString();

    profileContents += (generatorProfile->hasEqOperator() ?
                            TRUE_VALUE :
                            FALSE_VALUE)
                       + (generatorProfile->hasNeqOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasLtOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasLeqOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasGtOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasGeqOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasAndOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasOrOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasXorOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE)
                       + (generatorProfile->hasNotOperator() ?
                              TRUE_VALUE :
                              FALSE_VALUE);

    // Arithmetic operators.

    profileContents += generatorProfile->plusString()
                       + generatorProfile->minusString()
                       + generatorProfile->timesString()
                       + generatorProfile->divideString()
                       + generatorProfile->powerString()
                       + generatorProfile->squareRootString()
                       + generatorProfile->squareString()
                       + generatorProfile->absoluteValueString()
                       + generatorProfile->exponentialString()
                       + generatorProfile->naturalLogarithmString()
                       + generatorProfile->commonLogarithmString()
                       + generatorProfile->ceilingString()
                       + generatorProfile->floorString()
                       + generatorProfile->minString()
                       + generatorProfile->maxString()
                       + generatorProfile->remString();

    profileContents += generatorProfile->hasPowerOperator() ?
                           TRUE_VALUE :
                           FALSE_VALUE;

    // Trigonometric operators.

    profileContents += generatorProfile->sinString()
                       + generatorProfile->cosString()
                       + generatorProfile->tanString()
                       + generatorProfile->secString()
                       + generatorProfile->cscString()
                       + generatorProfile->cotString()
                       + generatorProfile->sinhString()
                       + generatorProfile->coshString()
                       + generatorProfile->tanhString()
                       + generatorProfile->sechString()
                       + generatorProfile->cschString()
                       + generatorProfile->cothString()
                       + generatorProfile->asinString()
                       + generatorProfile->acosString()
                       + generatorProfile->atanString()
                       + generatorProfile->asecString()
                       + generatorProfile->acscString()
                       + generatorProfile->acotString()
                       + generatorProfile->asinhString()
                       + generatorProfile->acoshString()
                       + generatorProfile->atanhString()
                       + generatorProfile->asechString()
                       + generatorProfile->acschString()
                       + generatorProfile->acothString();

    // Piecewise statement.

    profileContents += generatorProfile->conditionalOperatorIfString()
                       + generatorProfile->conditionalOperatorElseString()
                       + generatorProfile->piecewiseIfString()
                       + generatorProfile->piecewiseElseString();

    profileContents += generatorProfile->hasConditionalOperator() ?
                           TRUE_VALUE :
                           FALSE_VALUE;

    // Constants.

    profileContents += generatorProfile->trueString()
                       + generatorProfile->falseString()
                       + generatorProfile->eString()
                       + generatorProfile->piString()
                       + generatorProfile->infString()
                       + generatorProfile->nanString();

    // Arithmetic functions.

    profileContents += generatorProfile->eqFunctionString()
                       + generatorProfile->neqFunctionString()
                       + generatorProfile->ltFunctionString()
                       + generatorProfile->leqFunctionString()
                       + generatorProfile->gtFunctionString()
                       + generatorProfile->geqFunctionString()
                       + generatorProfile->andFunctionString()
                       + generatorProfile->orFunctionString()
                       + generatorProfile->xorFunctionString()
                       + generatorProfile->notFunctionString()
                       + generatorProfile->minFunctionString()
                       + generatorProfile->maxFunctionString();

    // Trigonometric functions.

    profileContents += generatorProfile->secFunctionString()
                       + generatorProfile->cscFunctionString()
                       + generatorProfile->cotFunctionString()
                       + generatorProfile->sechFunctionString()
                       + generatorProfile->cschFunctionString()
                       + generatorProfile->cothFunctionString()
                       + generatorProfile->asecFunctionString()
                       + generatorProfile->acscFunctionString()
                       + generatorProfile->acotFunctionString()
                       + generatorProfile->asechFunctionString()
                       + generatorProfile->acschFunctionString()
                       + generatorProfile->acothFunctionString();

    // Miscellaneous.
    // Note: we do NOT include interfaceFileNameString() since it may be the
    //       only thing that someone might change, so that the generated file
    //       works with the file name it is to be given.

    profileContents += generatorProfile->commentString()
                       + generatorProfile->originCommentString();

    profileContents += generatorProfile->interfaceHeaderString()
                       + generatorProfile->implementationHeaderString();

    profileContents += generatorProfile->interfaceVersionString()
                       + generatorProfile->implementationVersionString();

    profileContents += generatorProfile->interfaceLibcellmlVersionString()
                       + generatorProfile->implementationLibcellmlVersionString();

    profileContents += generatorProfile->interfaceStateCountString()
                       + generatorProfile->implementationStateCountString();

    profileContents += generatorProfile->interfaceVariableCountString()
                       + generatorProfile->implementationVariableCountString();

    profileContents += generatorProfile->variableTypeObjectString(false, false);
    profileContents += generatorProfile->variableTypeObjectString(false, true);
    profileContents += generatorProfile->variableTypeObjectString(true, false);
    profileContents += generatorProfile->variableTypeObjectString(true, true);

    profileContents += generatorProfile->variableOfIntegrationVariableTypeString()
                       + generatorProfile->stateVariableTypeString()
                       + generatorProfile->constantVariableTypeString()
                       + generatorProfile->computedConstantVariableTypeString()
                       + generatorProfile->algebraicVariableTypeString()
                       + generatorProfile->externalVariableTypeString();

    profileContents += generatorProfile->variableInfoObjectString();

    profileContents += generatorProfile->interfaceVoiInfoString()
                       + generatorProfile->implementationVoiInfoString();

    profileContents += generatorProfile->interfaceStateInfoString()
                       + generatorProfile->implementationStateInfoString();

    profileContents += generatorProfile->interfaceVariableInfoString()
                       + generatorProfile->implementationVariableInfoString();

    profileContents += generatorProfile->variableInfoEntryString();

    profileContents += generatorProfile->voiString();

    profileContents += generatorProfile->statesArrayString()
                       + generatorProfile->ratesArrayString()
                       + generatorProfile->variablesArrayString();

    profileContents += generatorProfile->externalVariableMethodTypeDefinitionString(false)
                       + generatorProfile->externalVariableMethodTypeDefinitionString(true);

    profileContents += generatorProfile->externalVariableMethodCallString(false)
                       + generatorProfile->externalVariableMethodCallString(true);

    profileContents += generatorProfile->rootFindingInfoObjectString(false)
                       + generatorProfile->rootFindingInfoObjectString(true)
                       + generatorProfile->externNlaSolveMethodString()
                       + generatorProfile->findRootCallString(false)
                       + generatorProfile->findRootCallString(true)
                       + generatorProfile->findRootMethodString(false)
                       + generatorProfile->findRootMethodString(true)
                       + generatorProfile->nlaSolveCallString(false)
                       + generatorProfile->nlaSolveCallString(true)
                       + generatorProfile->objectiveFunctionMethodString(false)
                       + generatorProfile->objectiveFunctionMethodString(true)
                       + generatorProfile->uArrayString()
                       + generatorProfile->fArrayString();

    profileContents += generatorProfile->interfaceCreateStatesArrayMethodString()
                       + generatorProfile->implementationCreateStatesArrayMethodString();

    profileContents += generatorProfile->interfaceCreateVariablesArrayMethodString()
                       + generatorProfile->implementationCreateVariablesArrayMethodString();

    profileContents += generatorProfile->interfaceDeleteArrayMethodString()
                       + generatorProfile->implementationDeleteArrayMethodString();

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(false, false)
                       + generatorProfile->implementationInitialiseVariablesMethodString(false, false);

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(false, true)
                       + generatorProfile->implementationInitialiseVariablesMethodString(false, true);

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(true, false)
                       + generatorProfile->implementationInitialiseVariablesMethodString(true, false);

    profileContents += generatorProfile->interfaceInitialiseVariablesMethodString(true, true)
                       + generatorProfile->implementationInitialiseVariablesMethodString(true, true);

    profileContents += generatorProfile->interfaceComputeComputedConstantsMethodString()
                       + generatorProfile->implementationComputeComputedConstantsMethodString();

    profileContents += generatorProfile->interfaceComputeRatesMethodString(false)
                       + generatorProfile->implementationComputeRatesMethodString(false);

    profileContents += generatorProfile->interfaceComputeRatesMethodString(true)
                       + generatorProfile->implementationComputeRatesMethodString(true);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(false, false)
                       + generatorProfile->implementationComputeVariablesMethodString(false, false);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(false, true)
                       + generatorProfile->implementationComputeVariablesMethodString(false, true);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(true, false)
                       + generatorProfile->implementationComputeVariablesMethodString(true, false);

    profileContents += generatorProfile->interfaceComputeVariablesMethodString(true, true)
                       + generatorProfile->implementationComputeVariablesMethodString(true, true);

    profileContents += generatorProfile->emptyMethodString();

    profileContents += generatorProfile->indentString();

    profileContents += generatorProfile->openArrayInitialiserString()
                       + generatorProfile->closeArrayInitialiserString();

    profileContents += generatorProfile->openArrayString()
                       + generatorProfile->closeArrayString();

    profileContents += generatorProfile->arrayElementSeparatorString();

    profileContents += generatorProfile->stringDelimiterString();

    profileContents += generatorProfile->commandSeparatorString();

    return profileContents;
}